

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O0

bool DecodeBase58(char *psz,vector<unsigned_char,_std::allocator<unsigned_char>_> *vch,
                 int max_ret_len)

{
  bool bVar1;
  byte *pbVar2;
  reference puVar3;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  int i;
  int carry;
  int size;
  int length;
  int zeroes;
  iterator it;
  reverse_iterator it_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b256;
  undefined7 in_stack_fffffffffffffef8;
  char in_stack_fffffffffffffeff;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff18;
  size_type in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  uchar uVar4;
  undefined1 *in_stack_ffffffffffffff30;
  undefined5 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3d;
  byte in_stack_ffffffffffffff3e;
  byte bVar5;
  bool local_a9;
  int local_a8;
  int local_a0;
  int local_8c;
  int local_88;
  byte *local_78;
  bool local_69;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = in_RDI;
  while( true ) {
    local_a9 = false;
    if (*local_78 != 0) {
      local_a9 = IsSpace(in_stack_fffffffffffffeff);
    }
    if (local_a9 == false) break;
    local_78 = local_78 + 1;
  }
  local_88 = 0;
  local_8c = 0;
  for (; *local_78 == 0x31; local_78 = local_78 + 1) {
    local_88 = local_88 + 1;
    if (in_EDX < local_88) {
      local_69 = false;
      goto LAB_00d6bf62;
    }
  }
  strlen((char *)local_78);
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),in_stack_ffffffffffffff20
             ,in_stack_ffffffffffffff18);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  while( true ) {
    bVar5 = 0;
    if (*local_78 != 0) {
      bVar1 = IsSpace(in_stack_fffffffffffffeff);
      bVar5 = bVar1 ^ 0xff;
    }
    if ((bVar5 & 1) == 0) goto LAB_00d6bdc6;
    local_a0 = (int)mapBase58[*local_78];
    if (local_a0 == -1) {
      local_69 = false;
      goto LAB_00d6bf55;
    }
    local_a8 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin(in_stack_ffffffffffffff10);
    while( true ) {
      if ((local_a0 != 0) || (in_stack_ffffffffffffff3e = 0, local_a8 < local_8c)) {
        in_stack_ffffffffffffff30 = local_38;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rend(in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff3d =
             std::
             operator==<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_ffffffffffffff08,
                        (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        in_stack_ffffffffffffff3e = in_stack_ffffffffffffff3d ^ 0xff;
      }
      if ((in_stack_ffffffffffffff3e & 1) == 0) break;
      pbVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      local_a0 = (uint)*pbVar2 * 0x3a + local_a0;
      uVar4 = (uchar)(local_a0 % 0x100);
      puVar3 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      *puVar3 = uVar4;
      local_a0 = local_a0 / 0x100;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      local_a8 = local_a8 + 1;
    }
    if (local_a0 != 0) {
      __assert_fail("carry == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/base58.cpp"
                    ,0x45,"bool DecodeBase58(const char *, std::vector<unsigned char> &, int)");
    }
    local_8c = local_a8;
    if (in_EDX < local_a8 + local_88) break;
    local_78 = local_78 + 1;
  }
  local_69 = false;
LAB_00d6bf55:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff08);
LAB_00d6bf62:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_69;
LAB_00d6bdc6:
  while (bVar1 = IsSpace(in_stack_fffffffffffffeff), bVar1) {
    local_78 = local_78 + 1;
  }
  if (*local_78 == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_ffffffffffffff08,
                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    __gnu_cxx::operator-
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_ffffffffffffff08,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff3e,
                                       CONCAT15(in_stack_ffffffffffffff3d,in_stack_ffffffffffffff38)
                                      )),(size_type)in_stack_ffffffffffffff30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
              (in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (value_type_conflict *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8))
    ;
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      bVar1 = __gnu_cxx::
              operator==<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffff08,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffff08 = in_RSI;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_RSI,in_stack_ffffffffffffff04);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (in_stack_ffffffffffffff08,
                 (value_type_conflict *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    local_69 = true;
  }
  else {
    local_69 = false;
  }
  goto LAB_00d6bf55;
}

Assistant:

[[nodiscard]] static bool DecodeBase58(const char* psz, std::vector<unsigned char>& vch, int max_ret_len)
{
    // Skip leading spaces.
    while (*psz && IsSpace(*psz))
        psz++;
    // Skip and count leading '1's.
    int zeroes = 0;
    int length = 0;
    while (*psz == '1') {
        zeroes++;
        if (zeroes > max_ret_len) return false;
        psz++;
    }
    // Allocate enough space in big-endian base256 representation.
    int size = strlen(psz) * 733 /1000 + 1; // log(58) / log(256), rounded up.
    std::vector<unsigned char> b256(size);
    // Process the characters.
    static_assert(std::size(mapBase58) == 256, "mapBase58.size() should be 256"); // guarantee not out of range
    while (*psz && !IsSpace(*psz)) {
        // Decode base58 character
        int carry = mapBase58[(uint8_t)*psz];
        if (carry == -1)  // Invalid b58 character
            return false;
        int i = 0;
        for (std::vector<unsigned char>::reverse_iterator it = b256.rbegin(); (carry != 0 || i < length) && (it != b256.rend()); ++it, ++i) {
            carry += 58 * (*it);
            *it = carry % 256;
            carry /= 256;
        }
        assert(carry == 0);
        length = i;
        if (length + zeroes > max_ret_len) return false;
        psz++;
    }
    // Skip trailing spaces.
    while (IsSpace(*psz))
        psz++;
    if (*psz != 0)
        return false;
    // Skip leading zeroes in b256.
    std::vector<unsigned char>::iterator it = b256.begin() + (size - length);
    // Copy result into output vector.
    vch.reserve(zeroes + (b256.end() - it));
    vch.assign(zeroes, 0x00);
    while (it != b256.end())
        vch.push_back(*(it++));
    return true;
}